

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void kj::anon_unknown_9::rmrfChildrenAndClose(int fd)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  dirent64 *pdVar5;
  void *pvVar6;
  size_t in_RCX;
  StringPtr path;
  Fault local_e8;
  Fault f_5;
  char *local_d8;
  bool local_ca;
  DebugExpression<bool> local_c9;
  DebugExpression<bool> _kjCondition;
  Fault f_4;
  SyscallResult local_ac;
  SyscallResult _kjSyscallResult_2;
  Fault f_3;
  SyscallResult local_8c;
  SyscallResult _kjSyscallResult_1;
  Fault f_2;
  SyscallResult local_68;
  undefined1 local_64 [4];
  SyscallResult _kjSyscallResult;
  int subdirFd;
  Fault f_1;
  int error;
  dirent *entry;
  undefined1 local_40 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:167:3)>
  _kjDefer167;
  Fault local_20;
  Fault f;
  DIR *dir;
  int fd_local;
  
  dir._4_4_ = fd;
  f.exception = (Exception *)fdopendir(fd);
  if (f.exception == (Exception *)0x0) {
    close(dir._4_4_);
    piVar4 = __errno_location();
    _::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0xa5,*piVar4,"fdopendir","");
    _::Debug::Fault::fatal(&local_20);
  }
  entry = (dirent *)&f;
  defer<kj::(anonymous_namespace)::rmrfChildrenAndClose(int)::__0>((kj *)local_40,(Type *)&entry);
  while( true ) {
    while( true ) {
      do {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pdVar5 = readdir64((DIR *)f.exception);
        uVar1 = dir._4_4_;
        if (pdVar5 == (dirent64 *)0x0) {
          piVar4 = __errno_location();
          if (*piVar4 != 0) {
            _::Debug::Fault::Fault
                      ((Fault *)&_kjSyscallResult,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0xb1,*piVar4,"readdir","");
            _::Debug::Fault::fatal((Fault *)&_kjSyscallResult);
          }
          _::
          Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++:167:3)>
          ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_disk_unix_c__:167:3)>
                       *)local_40);
          return;
        }
      } while ((pdVar5->d_name[0] == '.') &&
              ((pdVar5->d_name[1] == '\0' ||
               ((pdVar5->d_name[1] == '.' && (pdVar5->d_name[2] == '\0'))))));
      if (pdVar5->d_type == '\x04') break;
      if (pdVar5->d_type == '\0') {
        StringPtr::StringPtr((StringPtr *)&f_5,pdVar5->d_name);
        path.content.size_ = in_RCX;
        path.content.ptr = local_d8;
        local_ca = rmrf((anon_unknown_9 *)(ulong)uVar1,(int)f_5.exception,path);
        local_c9 = _::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_ca);
        bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_c9);
        if (!bVar2) {
          _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    (&local_e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0xc6,FAILED,"rmrf(fd, entry->d_name)","_kjCondition,",&local_c9);
          _::Debug::Fault::fatal(&local_e8);
        }
      }
      else {
        f_4.exception = (Exception *)((long)&dir + 4);
        local_ac = _::Debug::syscall<kj::(anonymous_namespace)::rmrfChildrenAndClose(int)::__3>
                             ((anon_class_16_2_092c1b7f *)&f_4,false);
        pvVar6 = _::Debug::SyscallResult::operator_cast_to_void_(&local_ac);
        if (pvVar6 == (void *)0x0) {
          iVar3 = _::Debug::SyscallResult::getErrorNumber(&local_ac);
          _::Debug::Fault::Fault
                    ((Fault *)&stack0xffffffffffffff38,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0xc3,iVar3,"unlinkat(fd, entry->d_name, 0)","");
          _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff38);
        }
      }
    }
    f_2.exception = (Exception *)local_64;
    local_68 = _::Debug::syscall<kj::(anonymous_namespace)::rmrfChildrenAndClose(int)::__1>
                         ((anon_class_24_3_0fc05dc6 *)&f_2,false);
    pvVar6 = _::Debug::SyscallResult::operator_cast_to_void_(&local_68);
    if (pvVar6 == (void *)0x0) break;
    rmrfChildrenAndClose((int)local_64);
    f_3.exception = (Exception *)((long)&dir + 4);
    local_8c = _::Debug::syscall<kj::(anonymous_namespace)::rmrfChildrenAndClose(int)::__2>
                         ((anon_class_16_2_092c1b7f *)&f_3,false);
    pvVar6 = _::Debug::SyscallResult::operator_cast_to_void_(&local_8c);
    if (pvVar6 == (void *)0x0) {
      iVar3 = _::Debug::SyscallResult::getErrorNumber(&local_8c);
      _::Debug::Fault::Fault
                ((Fault *)&stack0xffffffffffffff58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xc1,iVar3,"unlinkat(fd, entry->d_name, AT_REMOVEDIR)","");
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff58);
    }
  }
  iVar3 = _::Debug::SyscallResult::getErrorNumber(&local_68);
  _::Debug::Fault::Fault
            ((Fault *)&stack0xffffffffffffff78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0xbf,iVar3,
             "subdirFd = openat( fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW)"
             ,"");
  _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff78);
}

Assistant:

static void rmrfChildrenAndClose(int fd) {
  // Assumes fd is seeked to beginning.

  DIR* dir = fdopendir(fd);
  if (dir == nullptr) {
    close(fd);
    KJ_FAIL_SYSCALL("fdopendir", errno);
  };
  KJ_DEFER(closedir(dir));

  for (;;) {
    errno = 0;
    struct dirent* entry = readdir(dir);
    if (entry == nullptr) {
      int error = errno;
      if (error == 0) {
        break;
      } else {
        KJ_FAIL_SYSCALL("readdir", error);
      }
    }

    if (entry->d_name[0] == '.' &&
        (entry->d_name[1] == '\0' ||
         (entry->d_name[1] == '.' &&
          entry->d_name[2] == '\0'))) {
      // ignore . and ..
    } else {
#ifdef DT_UNKNOWN    // d_type is not available on all platforms.
      if (entry->d_type == DT_DIR) {
        int subdirFd;
        KJ_SYSCALL(subdirFd = openat(
            fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW));
        rmrfChildrenAndClose(subdirFd);
        KJ_SYSCALL(unlinkat(fd, entry->d_name, AT_REMOVEDIR));
      } else if (entry->d_type != DT_UNKNOWN) {
        KJ_SYSCALL(unlinkat(fd, entry->d_name, 0));
      } else {
#endif
        KJ_ASSERT(rmrf(fd, entry->d_name));
#ifdef DT_UNKNOWN
      }
#endif
    }
  }
}